

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O2

void __thiscall
AnnotatorCoverage_automaticIdsUndefined_Test::AnnotatorCoverage_automaticIdsUndefined_Test
          (AnnotatorCoverage_automaticIdsUndefined_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0012cd78;
  return;
}

Assistant:

TEST(AnnotatorCoverage, automaticIdsUndefined)
{
    auto annotator = libcellml::Annotator::create();
    auto model = libcellml::Model::create();

    annotator->setModel(model);

    annotator->assignIds(libcellml::CellmlElementType::UNDEFINED);
    EXPECT_TRUE(annotator->hasModel());

    EXPECT_EQ("", model->id());
}